

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_create(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **ctx)

{
  int iVar1;
  long in_RDI;
  int ret;
  EVP_PKEY *pkey;
  EVP_PKEY_CTX *evpctx;
  int local_24;
  EVP_PKEY *local_20;
  EVP_PKEY_CTX *local_18;
  
  local_18 = (EVP_PKEY_CTX *)0x0;
  local_20 = (EVP_PKEY *)0x0;
  local_18 = EVP_PKEY_CTX_new_id((int)*(undefined8 *)(in_RDI + 0x18),(ENGINE *)0x0);
  if (local_18 == (EVP_PKEY_CTX *)0x0) {
    local_24 = 0x203;
  }
  else {
    iVar1 = EVP_PKEY_keygen_init(local_18);
    if (iVar1 < 1) {
      local_24 = 0x203;
    }
    else {
      iVar1 = EVP_PKEY_keygen(local_18,&local_20);
      if (iVar1 < 1) {
        local_24 = 0x203;
      }
      else {
        local_24 = evp_keyex_init((ptls_key_exchange_algorithm_t *)ctx,
                                  (ptls_key_exchange_context_t **)evpctx,pkey);
        if (local_24 == 0) {
          local_20 = (EVP_PKEY *)0x0;
          local_24 = 0;
        }
      }
    }
  }
  if (local_20 != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(local_20);
  }
  if (local_18 != (EVP_PKEY_CTX *)0x0) {
    EVP_PKEY_CTX_free(local_18);
  }
  return local_24;
}

Assistant:

static int evp_keyex_create(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **ctx)
{
    EVP_PKEY_CTX *evpctx = NULL;
    EVP_PKEY *pkey = NULL;
    int ret;

    /* generate private key */
    if ((evpctx = EVP_PKEY_CTX_new_id((int)algo->data, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_keygen_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_keygen(evpctx, &pkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    /* setup */
    if ((ret = evp_keyex_init(algo, ctx, pkey)) != 0)
        goto Exit;
    pkey = NULL;
    ret = 0;

Exit:
    if (pkey != NULL)
        EVP_PKEY_free(pkey);
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    return ret;
}